

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_intersect(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  _Bool _Var1;
  container_t *c1_00;
  container_t *c2_00;
  container_t *c2;
  container_t *c1;
  uint8_t type2;
  int iStack_38;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int pos2;
  int pos1;
  uint64_t answer;
  int length2;
  int length1;
  roaring_bitmap_t *x2_local;
  roaring_bitmap_t *x1_local;
  
  answer._4_4_ = (x1->high_low_container).size;
  answer._0_4_ = (x2->high_low_container).size;
  _pos2 = 0;
  _s2 = 0;
  iStack_38 = 0;
  _length2 = &x2->high_low_container;
  x2_local = x1;
  while( true ) {
    while( true ) {
      if (answer._4_4_ <= _s2 || (int32_t)answer <= iStack_38) {
        return _pos2 != 0;
      }
      c1._6_2_ = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s2);
      c1._4_2_ = ra_get_key_at_index(_length2,(uint16_t)iStack_38);
      if (c1._6_2_ == c1._4_2_) break;
      if (c1._6_2_ < c1._4_2_) {
        _s2 = ra_advance_until(&x2_local->high_low_container,c1._4_2_,_s2);
      }
      else {
        iStack_38 = ra_advance_until(_length2,c1._6_2_,iStack_38);
      }
    }
    c1_00 = ra_get_container_at_index
                      (&x2_local->high_low_container,(uint16_t)_s2,(uint8_t *)((long)&c1 + 3));
    c2_00 = ra_get_container_at_index(_length2,(uint16_t)iStack_38,(uint8_t *)((long)&c1 + 2));
    _Var1 = container_intersect(c1_00,c1._3_1_,c2_00,c1._2_1_);
    if (_Var1) break;
    _s2 = _s2 + 1;
    iStack_38 = iStack_38 + 1;
  }
  return true;
}

Assistant:

bool roaring_bitmap_intersect(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(& x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(& x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            if (container_intersect(c1, type1, c2, type2))
                return true;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(& x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(& x2->high_low_container, s1, pos2);
        }
    }
    return answer != 0;
}